

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool alwaysOverwritableFile(QString *fileName)

{
  char cVar1;
  bool bVar2;
  QLatin1String QVar3;
  QLatin1String QVar4;
  QLatin1String QVar5;
  QLatin1String QVar6;
  
  QVar3.m_data = (char *)0x14;
  QVar3.m_size = (qsizetype)fileName;
  cVar1 = QString::endsWith(QVar3,0x1458c7);
  if (cVar1 == '\0') {
    QVar4.m_data = (char *)0x14;
    QVar4.m_size = (qsizetype)fileName;
    cVar1 = QString::endsWith(QVar4,0x1458dc);
    if (cVar1 == '\0') {
      QVar5.m_data = (char *)0x17;
      QVar5.m_size = (qsizetype)fileName;
      cVar1 = QString::endsWith(QVar5,0x1458f1);
      if (cVar1 == '\0') {
        QVar6.m_data = (char *)0x36;
        QVar6.m_size = (qsizetype)fileName;
        bVar2 = (bool)QString::endsWith(QVar6,0x145909);
        return bVar2;
      }
    }
  }
  return true;
}

Assistant:

bool alwaysOverwritableFile(const QString &fileName)
{
    return (fileName.endsWith("/res/values/libs.xml"_L1)
            || fileName.endsWith("/AndroidManifest.xml"_L1)
            || fileName.endsWith("/res/values/strings.xml"_L1)
            || fileName.endsWith("/src/org/qtproject/qt/android/bindings/QtActivity.java"_L1));
}